

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstracttextdocumentlayout.cpp
# Opt level: O3

void QAbstractTextDocumentLayout::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  void **ppvVar6;
  void **ppvVar7;
  int iVar8;
  long in_FS_OFFSET;
  undefined8 in_XMM1_Qa;
  void *local_48;
  undefined4 *puStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  void *local_28 [3];
  long local_10;
  
  ppvVar6 = &local_48;
  ppvVar7 = &local_48;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == update && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == updateBlock && lVar2 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar1 == documentSizeChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar1 == pageCountChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 4;
    }
    goto switchD_0047480c_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_0047480c_default;
  switch(_id) {
  case 0:
    ppvVar6 = (void **)_a[1];
    goto LAB_00474903;
  case 1:
    local_48 = (void *)0x0;
    puStack_40 = (undefined4 *)0x0;
    local_38 = 0x41cdcd6500000000;
    uStack_30 = 0x41cdcd6500000000;
    ppvVar7 = local_28;
LAB_00474903:
    *ppvVar7 = (void *)0x0;
    ppvVar7[1] = ppvVar6;
    iVar8 = 0;
    break;
  case 2:
    puStack_40 = (undefined4 *)_a[1];
    local_48 = (void *)0x0;
    iVar8 = 2;
    ppvVar7 = &local_48;
    break;
  case 3:
    puStack_40 = (undefined4 *)_a[1];
    local_48 = (void *)0x0;
    iVar8 = 3;
    ppvVar7 = &local_48;
    break;
  case 4:
    local_28[0]._0_4_ = *_a[1];
    puStack_40 = (undefined4 *)local_28;
    local_48 = (void *)0x0;
    iVar8 = 4;
    ppvVar7 = &local_48;
    break;
  case 5:
    uVar5 = (**(code **)(**(long **)(*(long *)(_o + 8) + 8) + 0x70))();
    if ((undefined4 *)*_a != (undefined4 *)0x0) {
      *(undefined4 *)*_a = uVar5;
    }
    goto switchD_0047480c_default;
  case 6:
    uVar4 = (**(code **)(**(long **)(*(long *)(_o + 8) + 8) + 0x78))();
    puVar3 = (undefined8 *)*_a;
    if (puVar3 != (undefined8 *)0x0) {
      *puVar3 = uVar4;
      puVar3[1] = in_XMM1_Qa;
    }
  default:
    goto switchD_0047480c_default;
  }
  QMetaObject::activate(_o,&staticMetaObject,iVar8,ppvVar7);
switchD_0047480c_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractTextDocumentLayout::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractTextDocumentLayout *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->update((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1]))); break;
        case 1: _t->update(); break;
        case 2: _t->updateBlock((*reinterpret_cast< std::add_pointer_t<QTextBlock>>(_a[1]))); break;
        case 3: _t->documentSizeChanged((*reinterpret_cast< std::add_pointer_t<QSizeF>>(_a[1]))); break;
        case 4: _t->pageCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: { int _r = _t->d_func()->_q_dynamicPageCountSlot();
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 6: { QSizeF _r = _t->d_func()->_q_dynamicDocumentSizeSlot();
            if (_a[0]) *reinterpret_cast< QSizeF*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractTextDocumentLayout::*)(const QRectF & )>(_a, &QAbstractTextDocumentLayout::update, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractTextDocumentLayout::*)(const QTextBlock & )>(_a, &QAbstractTextDocumentLayout::updateBlock, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractTextDocumentLayout::*)(const QSizeF & )>(_a, &QAbstractTextDocumentLayout::documentSizeChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractTextDocumentLayout::*)(int )>(_a, &QAbstractTextDocumentLayout::pageCountChanged, 4))
            return;
    }
}